

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *target_00;
  cmOSXBundleGenerator *this_00;
  string local_108;
  Names local_d8;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_00987b98;
  std::__cxx11::string::string((string *)&this->DeviceLinkObject);
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  cmGeneratorTarget::GetExecutableNames
            (&local_d8,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmGeneratorTarget::Names::operator=
            (&(this->super_cmMakefileTargetGenerator).TargetNames,&local_d8);
  cmGeneratorTarget::Names::~Names(&local_d8);
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  target_00 = local_18;
  std::__cxx11::string::string
            ((string *)&local_108,
             (string *)
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target_00,&local_108);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  std::__cxx11::string::~string((string *)&local_108);
  cmOSXBundleGenerator::SetMacContentFolders
            ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator,
             &(this->super_cmMakefileTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->TargetNames =
    this->GeneratorTarget->GetExecutableNames(this->ConfigName);

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}